

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

string * __thiscall
t_rs_generator::rust_union_field_name_abi_cxx11_
          (string *__return_storage_ptr__,t_rs_generator *this,t_field *tfield)

{
  string base_field_name;
  string sStack_38;
  
  rust_camel_case(&sStack_38,this,&tfield->name_);
  rust_safe_name(__return_storage_ptr__,this,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::rust_union_field_name(t_field* tfield) {
  string base_field_name(rust_camel_case(tfield->get_name()));
  return rust_safe_name(base_field_name);
}